

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkAig.c
# Opt level: O1

Nwk_Man_t *
Nwk_ManCreateFromGia
          (Gia_Man_t *p,Vec_Int_t *vPPis,Vec_Int_t *vNodes,Vec_Int_t *vLeaves,Vec_Int_t **pvMapInv)

{
  int iVar1;
  int iVar2;
  char *__s;
  Gia_Obj_t *pGVar3;
  Gia_Obj_t *pGVar4;
  Nwk_Man_t *p_00;
  size_t sVar5;
  char *__dest;
  Vec_Int_t *p_01;
  int *piVar6;
  undefined8 *__ptr;
  Nwk_Obj_t *pNVar7;
  long lVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  int iVar12;
  ulong uVar13;
  
  Gia_ManCreateRefs(p);
  piVar6 = (int *)0x0;
  p_00 = Nwk_ManAlloc();
  __s = p->pName;
  if (__s == (char *)0x0) {
    __dest = (char *)0x0;
  }
  else {
    sVar5 = strlen(__s);
    __dest = (char *)malloc(sVar5 + 1);
    strcpy(__dest,__s);
  }
  p_00->pName = __dest;
  p_00->nFanioPlus = 0;
  Hop_ManStop(p_00->pManHop);
  p_00->pManHop = (Hop_Man_t *)0x0;
  iVar12 = vNodes->nSize;
  iVar1 = vPPis->nSize;
  iVar2 = vLeaves->nSize;
  iVar9 = iVar2;
  if (iVar2 < iVar1) {
    iVar9 = iVar1;
  }
  p_01 = (Vec_Int_t *)malloc(0x10);
  iVar10 = 0x10;
  if (0xe < (uint)(iVar9 + iVar12)) {
    iVar10 = iVar9 + iVar12 + 1;
  }
  p_01->nSize = 0;
  p_01->nCap = iVar10;
  if (iVar10 != 0) {
    piVar6 = (int *)malloc((long)iVar10 << 2);
  }
  p_01->pArray = piVar6;
  iVar12 = p->nObjs;
  __ptr = (undefined8 *)malloc((long)iVar12 * 8);
  if (0 < (long)iVar12) {
    pGVar3 = p->pObjs;
    iVar12 = iVar2 - iVar1;
    if (iVar12 == 0 || iVar2 < iVar1) {
      iVar12 = 0;
    }
    pNVar7 = Nwk_ManCreateNode(p_00,0,iVar12 + *p->pRefs);
    pGVar4 = p->pObjs;
    if ((pGVar4 <= pGVar3) && (pGVar3 < pGVar4 + p->nObjs)) {
      iVar12 = (int)((long)pGVar3 - (long)pGVar4 >> 2) * -0x55555555;
      __ptr[iVar12] = pNVar7;
      Vec_IntPush(p_01,iVar12);
      uVar13 = (ulong)(uint)vLeaves->nSize;
      if (0 < vLeaves->nSize) {
        lVar11 = 0;
        do {
          lVar8 = (long)vLeaves->pArray[lVar11];
          if ((lVar8 < 0) || (p->nObjs <= vLeaves->pArray[lVar11])) goto LAB_00490976;
          if (p->pObjs == (Gia_Obj_t *)0x0) break;
          pGVar3 = p->pObjs + lVar8;
          pNVar7 = Nwk_ManCreateCi(p_00,p->pRefs[lVar8]);
          pGVar4 = p->pObjs;
          if ((pGVar3 < pGVar4) || (pGVar4 + p->nObjs <= pGVar3)) goto LAB_00490957;
          iVar12 = (int)((long)pGVar3 - (long)pGVar4 >> 2) * -0x55555555;
          __ptr[iVar12] = pNVar7;
          if (p_01->nSize != pNVar7->Id) {
            __assert_fail("Vec_IntSize(vMaps) == Nwk_ObjId(ppCopies[Gia_ObjId(p,pObj)])",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/nwk/nwkAig.c"
                          ,0xb1,
                          "Nwk_Man_t *Nwk_ManCreateFromGia(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t **)"
                         );
          }
          Vec_IntPush(p_01,iVar12);
          lVar11 = lVar11 + 1;
          uVar13 = (ulong)vLeaves->nSize;
        } while (lVar11 < (long)uVar13);
      }
      for (; (int)uVar13 < vPPis->nSize; uVar13 = (ulong)((int)uVar13 + 1)) {
        Nwk_ManCreateCi(p_00,0);
        Vec_IntPush(p_01,-1);
      }
      if (0 < vNodes->nSize) {
        lVar11 = 0;
        do {
          lVar8 = (long)vNodes->pArray[lVar11];
          if ((lVar8 < 0) || (p->nObjs <= vNodes->pArray[lVar11])) goto LAB_00490976;
          if (p->pObjs == (Gia_Obj_t *)0x0) break;
          pGVar3 = p->pObjs + lVar8;
          pNVar7 = Nwk_ManCreateNode(p_00,2,p->pRefs[lVar8]);
          pGVar4 = p->pObjs;
          if ((pGVar3 < pGVar4) || (pGVar4 + p->nObjs <= pGVar3)) goto LAB_00490957;
          iVar12 = (int)((long)pGVar3 - (long)pGVar4 >> 2) * -0x55555555;
          __ptr[iVar12] = pNVar7;
          Nwk_ObjAddFanin(pNVar7,(Nwk_Obj_t *)__ptr[(int)(iVar12 - (*(uint *)pGVar3 & 0x1fffffff))])
          ;
          pGVar4 = p->pObjs;
          if ((pGVar3 < pGVar4) || (pGVar4 + p->nObjs <= pGVar3)) goto LAB_00490957;
          iVar12 = (int)((long)pGVar3 - (long)pGVar4 >> 2) * -0x55555555;
          Nwk_ObjAddFanin((Nwk_Obj_t *)__ptr[iVar12],
                          (Nwk_Obj_t *)
                          __ptr[(int)(iVar12 - (*(uint *)&pGVar3->field_0x4 & 0x1fffffff))]);
          pGVar4 = p->pObjs;
          if ((pGVar3 < pGVar4) || (pGVar4 + p->nObjs <= pGVar3)) goto LAB_00490957;
          iVar12 = (int)((long)pGVar3 - (long)pGVar4 >> 2) * -0x55555555;
          if (p_01->nSize != *(int *)(__ptr[iVar12] + 0x24)) {
            __assert_fail("Vec_IntSize(vMaps) == Nwk_ObjId(ppCopies[Gia_ObjId(p,pObj)])",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/nwk/nwkAig.c"
                          ,0xbe,
                          "Nwk_Man_t *Nwk_ManCreateFromGia(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t **)"
                         );
          }
          Vec_IntPush(p_01,iVar12);
          lVar11 = lVar11 + 1;
        } while (lVar11 < vNodes->nSize);
      }
      uVar13 = (ulong)(uint)vPPis->nSize;
      if (0 < vPPis->nSize) {
        lVar11 = 0;
        do {
          lVar8 = (long)vPPis->pArray[lVar11];
          if ((lVar8 < 0) || (p->nObjs <= vPPis->pArray[lVar11])) {
LAB_00490976:
            __assert_fail("v >= 0 && v < p->nObjs",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                          ,0x1af,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
          }
          if (p->pObjs == (Gia_Obj_t *)0x0) break;
          if (__ptr[lVar8] == 0) {
            __assert_fail("ppCopies[Gia_ObjId(p,pObj)] != NULL",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/nwk/nwkAig.c"
                          ,0xc3,
                          "Nwk_Man_t *Nwk_ManCreateFromGia(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t **)"
                         );
          }
          pGVar3 = p->pObjs + lVar8;
          pNVar7 = Nwk_ManCreateCo(p_00);
          pGVar4 = p->pObjs;
          if ((pGVar3 < pGVar4) || (pGVar4 + p->nObjs <= pGVar3)) goto LAB_00490957;
          Nwk_ObjAddFanin(pNVar7,(Nwk_Obj_t *)
                                 __ptr[(int)((ulong)((long)pGVar3 - (long)pGVar4) >> 2) *
                                       -0x55555555]);
          lVar11 = lVar11 + 1;
          uVar13 = (ulong)vPPis->nSize;
        } while (lVar11 < (long)uVar13);
      }
      while( true ) {
        iVar12 = vLeaves->nSize;
        if (iVar12 <= (int)uVar13) break;
        pNVar7 = Nwk_ManCreateCo(p_00);
        Nwk_ObjAddFanin(pNVar7,(Nwk_Obj_t *)*__ptr);
        uVar13 = (ulong)((int)uVar13 + 1);
      }
      if (iVar12 < vPPis->nSize) {
        iVar12 = vPPis->nSize;
      }
      if (p_01->nSize != iVar12 + vNodes->nSize + 1) {
        __assert_fail("Vec_IntSize(vMaps) == Vec_IntSize(vNodes) + Abc_MaxInt(Vec_IntSize(vPPis), Vec_IntSize(vLeaves)) + 1"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/nwk/nwkAig.c"
                      ,200,
                      "Nwk_Man_t *Nwk_ManCreateFromGia(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t **)"
                     );
      }
      if (__ptr != (undefined8 *)0x0) {
        free(__ptr);
      }
      *pvMapInv = p_01;
      return p_00;
    }
  }
LAB_00490957:
  __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                ,0x1b7,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
}

Assistant:

Nwk_Man_t * Nwk_ManCreateFromGia( Gia_Man_t * p, Vec_Int_t * vPPis, Vec_Int_t * vNodes, Vec_Int_t * vLeaves, Vec_Int_t ** pvMapInv )
{
    Nwk_Man_t * pNtk;
    Nwk_Obj_t ** ppCopies;
    Gia_Obj_t * pObj;
    Vec_Int_t * vMaps;
    int i;
//    assert( Vec_IntSize(vLeaves) >= Vec_IntSize(vPPis) );
    Gia_ManCreateRefs( p );
    pNtk = Nwk_ManAlloc();
    pNtk->pName = Abc_UtilStrsav( p->pName );
    pNtk->nFanioPlus = 0;
    Hop_ManStop( pNtk->pManHop );
    pNtk->pManHop = NULL;
    // allocate
    vMaps = Vec_IntAlloc( Vec_IntSize(vNodes) + Abc_MaxInt(Vec_IntSize(vPPis), Vec_IntSize(vLeaves)) + 1 );
    ppCopies = ABC_ALLOC( Nwk_Obj_t *, Gia_ManObjNum(p) );
    // copy objects
    pObj = Gia_ManConst0(p);
//    ppCopies[Gia_ObjId(p,pObj)] = Nwk_ManCreateNode( pNtk, 0, Gia_ObjRefNum(p,pObj) );
    ppCopies[Gia_ObjId(p,pObj)] = Nwk_ManCreateNode( pNtk, 0, Gia_ObjRefNum(p,pObj) + (Vec_IntSize(vLeaves) > Vec_IntSize(vPPis) ? Vec_IntSize(vLeaves) - Vec_IntSize(vPPis) : 0) );
    Vec_IntPush( vMaps, Gia_ObjId(p,pObj) );
    Gia_ManForEachObjVec( vLeaves, p, pObj, i )
    {
        ppCopies[Gia_ObjId(p,pObj)] = Nwk_ManCreateCi( pNtk, Gia_ObjRefNum(p,pObj) );
        assert( Vec_IntSize(vMaps) == Nwk_ObjId(ppCopies[Gia_ObjId(p,pObj)]) );
        Vec_IntPush( vMaps, Gia_ObjId(p,pObj) );
    }
    for ( i = Vec_IntSize(vLeaves); i < Vec_IntSize(vPPis); i++ )
    {
        Nwk_ManCreateCi( pNtk, 0 );
        Vec_IntPush( vMaps, -1 );
    }
    Gia_ManForEachObjVec( vNodes, p, pObj, i )
    {
        ppCopies[Gia_ObjId(p,pObj)] = Nwk_ManCreateNode( pNtk, 2, Gia_ObjRefNum(p,pObj) );
        Nwk_ObjAddFanin( ppCopies[Gia_ObjId(p,pObj)], ppCopies[Gia_ObjFaninId0p(p,pObj)] );
        Nwk_ObjAddFanin( ppCopies[Gia_ObjId(p,pObj)], ppCopies[Gia_ObjFaninId1p(p,pObj)] );
        assert( Vec_IntSize(vMaps) == Nwk_ObjId(ppCopies[Gia_ObjId(p,pObj)]) );
        Vec_IntPush( vMaps, Gia_ObjId(p,pObj) );
    }
    Gia_ManForEachObjVec( vPPis, p, pObj, i )
    {
        assert( ppCopies[Gia_ObjId(p,pObj)] != NULL );
        Nwk_ObjAddFanin( Nwk_ManCreateCo(pNtk), ppCopies[Gia_ObjId(p,pObj)] );
    }
    for ( i = Vec_IntSize(vPPis); i < Vec_IntSize(vLeaves); i++ )
        Nwk_ObjAddFanin( Nwk_ManCreateCo(pNtk), ppCopies[0] );
    assert( Vec_IntSize(vMaps) == Vec_IntSize(vNodes) + Abc_MaxInt(Vec_IntSize(vPPis), Vec_IntSize(vLeaves)) + 1 );
    ABC_FREE( ppCopies );
    *pvMapInv = vMaps;
    return pNtk;
}